

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_template.hpp
# Opt level: O3

void __thiscall
boost::function1<void,_boost::unit_test::basic_cstring<const_char>_>::~function1
          (function1<void,_boost::unit_test::basic_cstring<const_char>_> *this)

{
  function_buffer *pfVar1;
  vtable_base *pvVar2;
  
  pvVar2 = (this->super_function_base).vtable;
  if (pvVar2 != (vtable_base *)0x0) {
    if ((((ulong)pvVar2 & 1) == 0) &&
       (pvVar2->manager !=
        (_func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *)0x0)) {
      pfVar1 = &(this->super_function_base).functor;
      (*pvVar2->manager)(pfVar1,pfVar1,destroy_functor_tag);
    }
    (this->super_function_base).vtable = (vtable_base *)0x0;
  }
  return;
}

Assistant:

void clear()
    {
      if (vtable) {
        if (!this->has_trivial_copy_and_destroy())
          get_vtable()->clear(this->functor);
        vtable = 0;
      }
    }